

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extraUtilMisc.c
# Opt level: O0

uint Extra_TruthCanonP(uint uTruth,int nVars)

{
  uint uVar1;
  int local_1c;
  int k;
  uint uPerm;
  uint uTruthMin;
  int nVars_local;
  uint uTruth_local;
  
  if (Extra_TruthCanonP::pPerms == (char **)0x0) {
    Extra_TruthCanonP::nPerms = Extra_Factorial(nVars);
    Extra_TruthCanonP::pPerms = Extra_Permutations(nVars);
    Extra_TruthCanonP::nVarsOld = nVars;
  }
  else if (Extra_TruthCanonP::nVarsOld != nVars) {
    if (Extra_TruthCanonP::pPerms != (char **)0x0) {
      free(Extra_TruthCanonP::pPerms);
      Extra_TruthCanonP::pPerms = (char **)0x0;
    }
    Extra_TruthCanonP::nPerms = Extra_Factorial(nVars);
    Extra_TruthCanonP::pPerms = Extra_Permutations(nVars);
    Extra_TruthCanonP::nVarsOld = nVars;
  }
  k = -1;
  for (local_1c = 0; local_1c < Extra_TruthCanonP::nPerms; local_1c = local_1c + 1) {
    uVar1 = Extra_TruthPermute(uTruth,Extra_TruthCanonP::pPerms[local_1c],nVars,0);
    if (uVar1 < (uint)k) {
      k = uVar1;
    }
  }
  return k;
}

Assistant:

unsigned Extra_TruthCanonP( unsigned uTruth, int nVars )
{
    static int nVarsOld, nPerms;
    static char ** pPerms = NULL;

    unsigned uTruthMin, uPerm;
    int k;

    if ( pPerms == NULL )
    {
        nPerms = Extra_Factorial( nVars );   
        pPerms = Extra_Permutations( nVars );
        nVarsOld = nVars;
    }
    else if ( nVarsOld != nVars )
    {
        ABC_FREE( pPerms );
        nPerms = Extra_Factorial( nVars );   
        pPerms = Extra_Permutations( nVars );
        nVarsOld = nVars;
    }

    uTruthMin = 0xFFFFFFFF;
    for ( k = 0; k < nPerms; k++ )
    {
        uPerm = Extra_TruthPermute( uTruth, pPerms[k], nVars, 0 );
        if ( uTruthMin > uPerm )
            uTruthMin = uPerm;
    }
    return uTruthMin;
}